

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z1_4xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx,
               int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  uint uVar21;
  long in_RCX;
  long lVar22;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar23 [32];
  int in_stack_00000008;
  int i_2;
  __m128i dstvec [16];
  int i;
  int base;
  __m128i res1;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a1_128;
  __m128i a0_128;
  __m128i mask128;
  __m128i base_inc128;
  __m128i max_base_x128;
  __m128i a_mbase_x;
  __m256i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int i_1;
  int base_1;
  __m128i res1_1;
  __m256i shift_1;
  __m256i res_1;
  __m256i b_1;
  int r_1;
  int x_1;
  __m128i mask128_1;
  __m128i base_inc128_1;
  __m128i max_base_x128_1;
  __m128i a_mbase_x_1;
  __m256i diff_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a0_1;
  int max_base_x_1;
  int frac_bits_1;
  int local_1124;
  undefined8 local_1120 [37];
  int local_ff8;
  int local_ff4;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  undefined1 local_fa0 [32];
  int local_f68;
  uint local_f64;
  undefined1 local_f60 [16];
  undefined1 local_f50 [16];
  undefined1 local_f40 [16];
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 local_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [16];
  undefined1 auStack_ef0 [16];
  undefined1 local_ee0 [32];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined1 local_ea0 [32];
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined1 auStack_e70 [16];
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined1 auStack_e50 [16];
  uint local_e28;
  int local_e24;
  byte local_e1c;
  undefined8 *local_e10;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  ushort local_d6a;
  undefined2 local_d68;
  ushort local_d66;
  undefined2 local_d64;
  undefined2 local_d62;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  ushort local_d04;
  ushort local_d02;
  uint8_t local_d00 [8];
  uint8_t auStack_cf8 [8];
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined1 local_ce0 [16];
  undefined1 auStack_cd0 [16];
  undefined2 local_cc0;
  undefined2 local_cbe;
  undefined2 local_cbc;
  undefined2 local_cba;
  undefined2 local_cb8;
  undefined2 local_cb6;
  undefined2 local_cb4;
  undefined2 local_cb2;
  undefined2 local_cb0;
  undefined2 local_cae;
  undefined2 local_cac;
  undefined2 local_caa;
  undefined2 local_ca8;
  undefined2 local_ca6;
  undefined2 local_ca4;
  undefined2 local_ca2;
  undefined1 local_ca0 [32];
  undefined2 local_c80;
  undefined2 local_c7e;
  undefined2 local_c7c;
  undefined2 local_c7a;
  undefined2 local_c78;
  undefined2 local_c76;
  undefined2 local_c74;
  undefined2 local_c72;
  undefined2 local_c70;
  undefined2 local_c6e;
  undefined2 local_c6c;
  undefined2 local_c6a;
  undefined2 local_c68;
  undefined2 local_c66;
  undefined2 local_c64;
  undefined2 local_c62;
  undefined1 local_c60 [16];
  undefined1 auStack_c50 [16];
  ushort local_c40;
  ushort local_c3e;
  ushort local_c3c;
  ushort local_c3a;
  ushort local_c38;
  ushort local_c36;
  ushort local_c34;
  ushort local_c32;
  ushort local_c30;
  ushort local_c2e;
  ushort local_c2c;
  ushort local_c2a;
  ushort local_c28;
  ushort local_c26;
  ushort local_c24;
  ushort local_c22;
  undefined1 local_c20 [32];
  undefined2 local_c00;
  undefined2 local_bfe;
  undefined2 local_bfc;
  undefined2 local_bfa;
  undefined2 local_bf8;
  undefined2 local_bf6;
  undefined2 local_bf4;
  undefined2 local_bf2;
  undefined2 local_bf0;
  undefined2 local_bee;
  undefined2 local_bec;
  undefined2 local_bea;
  undefined2 local_be8;
  undefined2 local_be6;
  undefined2 local_be4;
  undefined2 local_be2;
  undefined1 local_be0 [32];
  ushort local_bc0;
  ushort local_bbe;
  ushort local_bbc;
  ushort local_bba;
  ushort local_bb8;
  ushort local_bb6;
  ushort local_bb4;
  ushort local_bb2;
  ushort local_bb0;
  ushort local_bae;
  ushort local_bac;
  ushort local_baa;
  ushort local_ba8;
  ushort local_ba6;
  ushort local_ba4;
  ushort local_ba2;
  undefined1 local_ba0 [16];
  ushort local_b90;
  ushort local_b8e;
  ushort local_b8c;
  ushort local_b8a;
  ushort local_b88;
  ushort local_b86;
  ushort local_b84;
  ushort local_b82;
  undefined1 local_b80 [16];
  ushort local_b70;
  ushort local_b6e;
  ushort local_b6c;
  ushort local_b6a;
  ushort local_b68;
  ushort local_b66;
  ushort local_b64;
  ushort local_b62;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined1 local_b00 [16];
  undefined1 auStack_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [32];
  int local_a98;
  uint local_a94;
  undefined1 local_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  int local_a08;
  uint local_a04;
  undefined1 local_a00 [16];
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [24];
  undefined8 uStack_948;
  undefined1 local_940 [32];
  uint local_908;
  int local_904;
  undefined8 *local_8f0;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined1 local_8a0 [16];
  ushort local_890;
  ushort local_88e;
  ushort local_88c;
  ushort local_88a;
  ushort local_888;
  ushort local_886;
  ushort local_884;
  ushort local_882;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  undefined1 local_820 [32];
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 *local_7d8;
  undefined1 (*local_7d0) [16];
  undefined1 (*local_7c8) [16];
  undefined1 (*local_7c0) [16];
  undefined1 (*local_7b8) [16];
  ushort local_7b0;
  ushort local_7ae;
  ushort local_7ac;
  ushort local_7aa;
  ushort local_7a8;
  ushort local_7a6;
  ushort local_7a4;
  ushort local_7a2;
  undefined1 local_7a0 [16];
  ushort local_790;
  ushort local_78e;
  ushort local_78c;
  ushort local_78a;
  ushort local_788;
  ushort local_786;
  ushort local_784;
  ushort local_782;
  ushort local_780;
  ushort local_77e;
  ushort local_77c;
  ushort local_77a;
  ushort local_778;
  ushort local_776;
  ushort local_774;
  ushort local_772;
  undefined1 local_770 [16];
  ushort local_754;
  ushort local_752;
  ushort local_750;
  ushort local_74e;
  ushort local_74c;
  ushort local_74a;
  ushort local_748;
  ushort local_746;
  undefined4 local_744;
  undefined1 local_740 [32];
  undefined4 local_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined4 local_6c4;
  undefined1 local_6c0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined4 local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined4 local_558;
  uint local_554;
  undefined4 local_550;
  uint local_54c;
  undefined4 local_548;
  uint local_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  undefined1 auStack_4d0 [16];
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  uint local_480;
  uint local_47c;
  uint local_478;
  uint local_474;
  uint local_470;
  uint local_46c;
  uint local_468;
  uint local_464;
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 local_428;
  undefined4 local_424;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  undefined4 local_364;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  int local_344;
  int local_340;
  int local_33c;
  uint local_338;
  int local_334;
  int local_330;
  int local_32c;
  uint local_328;
  undefined4 local_324;
  undefined1 local_320 [32];
  undefined4 local_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined4 local_2a4;
  undefined1 local_2a0 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined4 local_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_50;
  undefined8 uStack_48;
  
  local_e1c = (byte)in_R8D;
  if (in_stack_00000008 < 0xc) {
    local_e10 = local_1120;
    local_e24 = 6 - in_R8D;
    uVar21 = in_EDI + 3 << (local_e1c & 0x1f);
    local_e28 = uVar21;
    local_d62 = 0x10;
    local_ca2 = 0x10;
    local_ca4 = 0x10;
    local_ca6 = 0x10;
    local_ca8 = 0x10;
    local_caa = 0x10;
    local_cac = 0x10;
    local_cae = 0x10;
    local_cb0 = 0x10;
    local_cb2 = 0x10;
    local_cb4 = 0x10;
    local_cb6 = 0x10;
    local_cb8 = 0x10;
    local_cba = 0x10;
    local_cbc = 0x10;
    local_cbe = 0x10;
    local_cc0 = 0x10;
    auVar1 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar1 = vpinsrw_avx(auVar1,0x10,2);
    auVar1 = vpinsrw_avx(auVar1,0x10,3);
    auVar1 = vpinsrw_avx(auVar1,0x10,4);
    auVar1 = vpinsrw_avx(auVar1,0x10,5);
    auVar1 = vpinsrw_avx(auVar1,0x10,6);
    auVar1 = vpinsrw_avx(auVar1,0x10,7);
    auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar2 = vpinsrw_avx(auVar2,0x10,2);
    auVar2 = vpinsrw_avx(auVar2,0x10,3);
    auVar2 = vpinsrw_avx(auVar2,0x10,4);
    auVar2 = vpinsrw_avx(auVar2,0x10,5);
    auVar2 = vpinsrw_avx(auVar2,0x10,6);
    auStack_cd0 = vpinsrw_avx(auVar2,0x10,7);
    local_ce0 = auVar1;
    local_ce0._0_8_ = auVar1._0_8_;
    local_ce0._8_8_ = auVar1._8_8_;
    local_ec0 = local_ce0._0_8_;
    uStack_eb8 = local_ce0._8_8_;
    uStack_eb0 = auStack_cd0._0_8_;
    uStack_ea8 = auStack_cd0._8_8_;
    local_d02 = *(ushort *)(in_RCX + (long)(int)uVar21 * 2);
    local_b82 = local_d02;
    local_b84 = local_d02;
    local_b86 = local_d02;
    local_b88 = local_d02;
    local_b8a = local_d02;
    local_b8c = local_d02;
    local_b8e = local_d02;
    local_b90 = local_d02;
    auVar2 = vpinsrw_avx(ZEXT216(local_d02),(uint)local_d02,1);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_d02,2);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_d02,3);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_d02,4);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_d02,5);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_d02,6);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_d02,7);
    local_ba0 = auVar2;
    local_ba0._0_8_ = auVar2._0_8_;
    local_ba0._8_8_ = auVar2._8_8_;
    local_f10 = local_ba0._0_8_;
    uStack_f08 = local_ba0._8_8_;
    local_e28._0_2_ = (ushort)uVar21;
    local_d04 = (ushort)local_e28;
    local_b62 = (ushort)local_e28;
    local_b64 = (ushort)local_e28;
    local_b66 = (ushort)local_e28;
    local_b68 = (ushort)local_e28;
    local_b6a = (ushort)local_e28;
    local_b6c = (ushort)local_e28;
    local_b6e = (ushort)local_e28;
    local_b70 = (ushort)local_e28;
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_e28),uVar21 & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,uVar21 & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,uVar21 & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,uVar21 & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,uVar21 & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,uVar21 & 0xffff,6);
    auVar3 = vpinsrw_avx(auVar3,uVar21 & 0xffff,7);
    local_b80 = auVar3;
    local_b80._0_8_ = auVar3._0_8_;
    local_b80._8_8_ = auVar3._8_8_;
    local_f20 = local_b80._0_8_;
    uStack_f18 = local_b80._8_8_;
    local_d64 = 0x3f;
    local_c62 = 0x3f;
    local_c64 = 0x3f;
    local_c66 = 0x3f;
    local_c68 = 0x3f;
    local_c6a = 0x3f;
    local_c6c = 0x3f;
    local_c6e = 0x3f;
    local_c70 = 0x3f;
    local_c72 = 0x3f;
    local_c74 = 0x3f;
    local_c76 = 0x3f;
    local_c78 = 0x3f;
    local_c7a = 0x3f;
    local_c7c = 0x3f;
    local_c7e = 0x3f;
    local_c80 = 0x3f;
    auVar4 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar4 = vpinsrw_avx(auVar4,0x3f,2);
    auVar4 = vpinsrw_avx(auVar4,0x3f,3);
    auVar4 = vpinsrw_avx(auVar4,0x3f,4);
    auVar4 = vpinsrw_avx(auVar4,0x3f,5);
    auVar4 = vpinsrw_avx(auVar4,0x3f,6);
    auVar4 = vpinsrw_avx(auVar4,0x3f,7);
    auVar5 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar5 = vpinsrw_avx(auVar5,0x3f,2);
    auVar5 = vpinsrw_avx(auVar5,0x3f,3);
    auVar5 = vpinsrw_avx(auVar5,0x3f,4);
    auVar5 = vpinsrw_avx(auVar5,0x3f,5);
    auVar5 = vpinsrw_avx(auVar5,0x3f,6);
    auVar5 = vpinsrw_avx(auVar5,0x3f,7);
    auVar23._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
    auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
    local_ca0 = auVar23;
    local_ca0._16_8_ = auVar23._16_8_;
    local_ca0._24_8_ = auVar23._24_8_;
    local_f00 = auVar23._0_16_;
    auStack_ef0 = auVar23._16_16_;
    local_f64 = in_R9D;
    for (local_f68 = 0; local_f68 < in_EDI; local_f68 = local_f68 + 1) {
      local_ff4 = (int)local_f64 >> ((byte)(6 - in_R8D) & 0x1f);
      if ((int)uVar21 <= local_ff4) {
        for (local_ff8 = local_f68; local_ff8 < in_EDI; local_ff8 = local_ff8 + 1) {
          local_1120[(long)local_ff8 * 2] = local_ba0._0_8_;
          local_1120[(long)local_ff8 * 2 + 1] = local_ba0._8_8_;
        }
        break;
      }
      local_7b8 = (undefined1 (*) [16])(in_RCX + (long)local_ff4 * 2);
      local_f50 = *local_7b8;
      local_7c0 = (undefined1 (*) [16])(in_RCX + (long)local_ff4 * 2 + 2);
      local_f60 = *local_7c0;
      local_772 = (ushort)local_ff4;
      if (in_R8D == 0) {
        local_774 = local_772 + 1;
        local_776 = local_772 + 2;
        local_778 = local_772 + 3;
        local_77a = local_772 + 4;
        local_77c = local_772 + 5;
        local_77e = local_772 + 6;
        local_780 = local_772 + 7;
        local_746 = local_780;
        local_748 = local_77e;
        local_74a = local_77c;
        local_74c = local_77a;
        local_74e = local_778;
        local_750 = local_776;
        local_752 = local_774;
        local_754 = local_772;
        auVar4 = vpinsrw_avx(ZEXT216(local_772),(uint)local_774,1);
        auVar4 = vpinsrw_avx(auVar4,(uint)local_776,2);
        auVar4 = vpinsrw_avx(auVar4,(uint)local_778,3);
        auVar4 = vpinsrw_avx(auVar4,(uint)local_77a,4);
        auVar4 = vpinsrw_avx(auVar4,(uint)local_77c,5);
        auVar4 = vpinsrw_avx(auVar4,(uint)local_77e,6);
        local_770 = vpinsrw_avx(auVar4,(uint)local_780,7);
        local_f30 = local_770._0_8_;
        uStack_f28 = local_770._8_8_;
        local_d6a = (ushort)local_f64;
        local_ba2 = (ushort)local_f64;
        local_ba4 = (ushort)local_f64;
        local_ba6 = (ushort)local_f64;
        local_ba8 = (ushort)local_f64;
        local_baa = (ushort)local_f64;
        local_bac = (ushort)local_f64;
        local_bae = (ushort)local_f64;
        local_bb0 = (ushort)local_f64;
        local_bb2 = (ushort)local_f64;
        local_bb4 = (ushort)local_f64;
        local_bb6 = (ushort)local_f64;
        local_bb8 = (ushort)local_f64;
        local_bba = (ushort)local_f64;
        local_bbc = (ushort)local_f64;
        local_bbe = (ushort)local_f64;
        local_bc0 = (ushort)local_f64;
        auVar4 = vpinsrw_avx(ZEXT216((ushort)local_f64),local_f64 & 0xffff,1);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,2);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,3);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,4);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,5);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,6);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,7);
        auVar5 = vpinsrw_avx(ZEXT216((ushort)local_f64),local_f64 & 0xffff,1);
        auVar5 = vpinsrw_avx(auVar5,local_f64 & 0xffff,2);
        auVar5 = vpinsrw_avx(auVar5,local_f64 & 0xffff,3);
        auVar5 = vpinsrw_avx(auVar5,local_f64 & 0xffff,4);
        auVar5 = vpinsrw_avx(auVar5,local_f64 & 0xffff,5);
        auVar5 = vpinsrw_avx(auVar5,local_f64 & 0xffff,6);
        auVar5 = vpinsrw_avx(auVar5,local_f64 & 0xffff,7);
        local_be0._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
        local_be0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
        local_b00 = local_be0._0_16_;
        auStack_af0 = local_be0._16_16_;
        local_b20 = auVar23._0_16_;
        auStack_b10 = auVar23._16_16_;
        auVar11._16_8_ = local_be0._16_8_;
        auVar11._0_16_ = local_be0._0_16_;
        auVar11._24_8_ = local_be0._24_8_;
        auVar10._16_8_ = local_ca0._16_8_;
        auVar10._0_16_ = auVar23._0_16_;
        auVar10._24_8_ = local_ca0._24_8_;
        local_6c0 = vpand_avx2(auVar11,auVar10);
        local_6c4 = 1;
        local_fe0 = vpsrlw_avx2(local_6c0,ZEXT416(1));
      }
      else {
        local_cf0 = *(undefined8 *)*local_7b8;
        uStack_ce8 = *(undefined8 *)(*local_7b8 + 8);
        local_d00 = (uint8_t  [8])HighbdEvenOddMaskx4[0]._0_8_;
        auStack_cf8 = (uint8_t  [8])HighbdEvenOddMaskx4[0]._8_8_;
        auVar5._8_8_ = HighbdEvenOddMaskx4[0]._8_8_;
        auVar5._0_8_ = HighbdEvenOddMaskx4[0]._0_8_;
        local_f50 = vpshufb_avx(*local_7b8,auVar5);
        local_f60 = vpsrldq_avx(local_f50,8);
        local_7a4 = local_772 + 2;
        local_7a6 = local_772 + 4;
        local_7a8 = local_772 + 6;
        local_7aa = local_772 + 8;
        local_7ac = local_772 + 10;
        local_7ae = local_772 + 0xc;
        local_7b0 = local_772 + 0xe;
        local_7a2 = local_772;
        local_782 = local_7b0;
        local_784 = local_7ae;
        local_786 = local_7ac;
        local_788 = local_7aa;
        local_78a = local_7a8;
        local_78c = local_7a6;
        local_78e = local_7a4;
        local_790 = local_772;
        auVar4 = vpinsrw_avx(ZEXT216(local_772),(uint)local_7a4,1);
        auVar4 = vpinsrw_avx(auVar4,(uint)local_7a6,2);
        auVar4 = vpinsrw_avx(auVar4,(uint)local_7a8,3);
        auVar4 = vpinsrw_avx(auVar4,(uint)local_7aa,4);
        auVar4 = vpinsrw_avx(auVar4,(uint)local_7ac,5);
        auVar4 = vpinsrw_avx(auVar4,(uint)local_7ae,6);
        local_7a0 = vpinsrw_avx(auVar4,(uint)local_7b0,7);
        local_f30 = local_7a0._0_8_;
        uStack_f28 = local_7a0._8_8_;
        local_d66 = (ushort)local_f64;
        local_c22 = (ushort)local_f64;
        local_c24 = (ushort)local_f64;
        local_c26 = (ushort)local_f64;
        local_c28 = (ushort)local_f64;
        local_c2a = (ushort)local_f64;
        local_c2c = (ushort)local_f64;
        local_c2e = (ushort)local_f64;
        local_c30 = (ushort)local_f64;
        local_c32 = (ushort)local_f64;
        local_c34 = (ushort)local_f64;
        local_c36 = (ushort)local_f64;
        local_c38 = (ushort)local_f64;
        local_c3a = (ushort)local_f64;
        local_c3c = (ushort)local_f64;
        local_c3e = (ushort)local_f64;
        local_c40 = (ushort)local_f64;
        auVar4 = vpinsrw_avx(ZEXT216((ushort)local_f64),local_f64 & 0xffff,1);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,2);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,3);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,4);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,5);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,6);
        local_c60 = vpinsrw_avx(auVar4,local_f64 & 0xffff,7);
        auVar4 = vpinsrw_avx(ZEXT216((ushort)local_f64),local_f64 & 0xffff,1);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,2);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,3);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,4);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,5);
        auVar4 = vpinsrw_avx(auVar4,local_f64 & 0xffff,6);
        auStack_c50 = vpinsrw_avx(auVar4,local_f64 & 0xffff,7);
        local_680 = local_c60._0_8_;
        uStack_678 = local_c60._8_8_;
        uStack_670 = auStack_c50._0_8_;
        uStack_668 = auStack_c50._8_8_;
        auVar15._16_8_ = auStack_c50._0_8_;
        auVar15._0_16_ = local_c60;
        auVar15._24_8_ = auStack_c50._8_8_;
        local_ac0 = vpsllw_avx2(auVar15,ZEXT416(in_R8D));
        local_d68 = 0x3f;
        local_be2 = 0x3f;
        local_be4 = 0x3f;
        local_be6 = 0x3f;
        local_be8 = 0x3f;
        local_bea = 0x3f;
        local_bec = 0x3f;
        local_bee = 0x3f;
        local_bf0 = 0x3f;
        local_bf2 = 0x3f;
        local_bf4 = 0x3f;
        local_bf6 = 0x3f;
        local_bf8 = 0x3f;
        local_bfa = 0x3f;
        local_bfc = 0x3f;
        local_bfe = 0x3f;
        local_c00 = 0x3f;
        auVar4 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
        auVar4 = vpinsrw_avx(auVar4,0x3f,2);
        auVar4 = vpinsrw_avx(auVar4,0x3f,3);
        auVar4 = vpinsrw_avx(auVar4,0x3f,4);
        auVar4 = vpinsrw_avx(auVar4,0x3f,5);
        auVar4 = vpinsrw_avx(auVar4,0x3f,6);
        auVar4 = vpinsrw_avx(auVar4,0x3f,7);
        auVar5 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
        auVar5 = vpinsrw_avx(auVar5,0x3f,2);
        auVar5 = vpinsrw_avx(auVar5,0x3f,3);
        auVar5 = vpinsrw_avx(auVar5,0x3f,4);
        auVar5 = vpinsrw_avx(auVar5,0x3f,5);
        auVar5 = vpinsrw_avx(auVar5,0x3f,6);
        auVar5 = vpinsrw_avx(auVar5,0x3f,7);
        local_c20._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
        local_c20._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
        local_ae0 = local_c20._0_16_;
        auStack_ad0 = local_c20._16_16_;
        auVar12._16_8_ = local_c20._16_8_;
        auVar12._0_16_ = local_c20._0_16_;
        auVar12._24_8_ = local_c20._24_8_;
        local_740 = vpand_avx2(local_ac0,auVar12);
        local_744 = 1;
        local_fe0 = vpsrlw_avx2(local_740,ZEXT416(1));
      }
      local_d20 = local_f50._0_8_;
      uStack_d18 = local_f50._8_8_;
      auStack_e50 = ZEXT416(1);
      local_e60 = local_f50._0_8_;
      uStack_e58 = local_f50._8_8_;
      local_d30 = local_f60._0_8_;
      uStack_d28 = local_f60._8_8_;
      auStack_e70 = auStack_e50;
      local_e80 = local_f60._0_8_;
      uStack_e78 = local_f60._8_8_;
      auStack_e70._0_8_ = auStack_e50._0_8_;
      local_b40 = local_f60._0_8_;
      uStack_b38 = local_f60._8_8_;
      uStack_b30 = auStack_e70._0_8_;
      uStack_b28 = 0;
      local_b60 = local_f50._0_8_;
      uStack_b58 = local_f50._8_8_;
      uStack_b50 = auStack_e70._0_8_;
      uStack_b48 = 0;
      auVar9._16_8_ = auStack_e70._0_8_;
      auVar9._0_16_ = local_f60;
      auVar9._24_8_ = 0;
      auVar8._16_8_ = auStack_e70._0_8_;
      auVar8._0_16_ = local_f50;
      auVar8._24_8_ = 0;
      local_ee0 = vpsubw_avx2(auVar9,auVar8);
      local_640 = local_f50._0_8_;
      uStack_638 = local_f50._8_8_;
      uStack_630 = auStack_e70._0_8_;
      uStack_628 = 0;
      local_644 = 5;
      auVar16._16_8_ = auStack_e70._0_8_;
      auVar16._0_16_ = local_f50;
      auVar16._24_8_ = 0;
      auVar6 = vpsllw_avx2(auVar16,ZEXT416(5));
      local_ea0._0_8_ = auVar6._0_8_;
      local_ea0._8_8_ = auVar6._8_8_;
      local_ea0._16_8_ = auVar6._16_8_;
      local_ea0._24_8_ = auVar6._24_8_;
      local_da0 = local_ea0._0_8_;
      uStack_d98 = local_ea0._8_8_;
      uStack_d90 = local_ea0._16_8_;
      uStack_d88 = local_ea0._24_8_;
      local_dc0 = local_ce0._0_8_;
      uStack_db8 = local_ce0._8_8_;
      uStack_db0 = auStack_cd0._0_8_;
      uStack_da8 = auStack_cd0._8_8_;
      auVar7._16_8_ = auStack_cd0._0_8_;
      auVar7._0_16_ = auVar1;
      auVar7._24_8_ = auStack_cd0._8_8_;
      local_ea0 = vpaddw_avx2(auVar6,auVar7);
      local_600 = local_ee0._0_8_;
      uStack_5f8 = local_ee0._8_8_;
      uStack_5f0 = local_ee0._16_8_;
      uStack_5e8 = local_ee0._24_8_;
      local_620 = local_fe0._0_8_;
      uStack_618 = local_fe0._8_8_;
      uStack_610 = local_fe0._16_8_;
      uStack_608 = local_fe0._24_8_;
      local_fa0 = vpmullw_avx2(local_ee0,local_fe0);
      local_de0 = local_ea0._0_8_;
      uStack_dd8 = local_ea0._8_8_;
      uStack_dd0 = local_ea0._16_8_;
      uStack_dc8 = local_ea0._24_8_;
      local_e00 = local_fa0._0_8_;
      uStack_df8 = local_fa0._8_8_;
      uStack_df0 = local_fa0._16_8_;
      uStack_de8 = local_fa0._24_8_;
      auVar6 = vpaddw_avx2(local_ea0,local_fa0);
      local_fc0._0_8_ = auVar6._0_8_;
      local_fc0._8_8_ = auVar6._8_8_;
      local_fc0._16_8_ = auVar6._16_8_;
      local_fc0._24_8_ = auVar6._24_8_;
      local_700 = local_fc0._0_8_;
      uStack_6f8 = local_fc0._8_8_;
      uStack_6f0 = local_fc0._16_8_;
      uStack_6e8 = local_fc0._24_8_;
      local_704 = 5;
      local_fc0 = vpsrlw_avx2(auVar6,ZEXT416(5));
      local_d60 = local_fc0._0_8_;
      uStack_d58 = local_fc0._8_8_;
      uStack_d50 = local_fc0._16_8_;
      uStack_d48 = local_fc0._24_8_;
      local_ff0 = local_fc0._0_8_;
      uStack_fe8 = local_fc0._8_8_;
      local_5d0 = local_b80._0_8_;
      uStack_5c8 = local_b80._8_8_;
      local_5e0 = local_f30;
      uStack_5d8 = uStack_f28;
      auVar17._8_8_ = uStack_f28;
      auVar17._0_8_ = local_f30;
      local_f40 = vpcmpgtw_avx(auVar3,auVar17);
      local_570 = local_ba0._0_8_;
      uStack_568 = local_ba0._8_8_;
      local_580 = local_fc0._0_8_;
      uStack_578 = local_fc0._8_8_;
      local_590 = local_f40._0_8_;
      uStack_588 = local_f40._8_8_;
      auVar4 = vpblendvb_avx(auVar2,local_fc0._0_16_,local_f40);
      *(undefined1 (*) [16])(local_1120 + (long)local_f68 * 2) = auVar4;
      local_f64 = in_R9D + local_f64;
    }
  }
  else {
    local_8f0 = local_1120;
    local_904 = 6 - in_R8D;
    uVar21 = in_EDI + 3 << (local_e1c & 0x1f);
    local_908 = uVar21;
    local_548 = 0x10;
    local_4a4 = 0x10;
    local_4a8 = 0x10;
    local_4ac = 0x10;
    local_4b0 = 0x10;
    local_4b4 = 0x10;
    local_4b8 = 0x10;
    local_4bc = 0x10;
    local_4c0 = 0x10;
    auVar1 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar1 = vpinsrd_avx(auVar1,0x10,2);
    auVar1 = vpinsrd_avx(auVar1,0x10,3);
    auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar2 = vpinsrd_avx(auVar2,0x10,2);
    auStack_4d0 = vpinsrd_avx(auVar2,0x10,3);
    local_4e0 = auVar1;
    local_4e0._0_8_ = auVar1._0_8_;
    local_4e0._8_8_ = auVar1._8_8_;
    local_9a0 = local_4e0._0_8_;
    uStack_998 = local_4e0._8_8_;
    uStack_990 = auStack_4d0._0_8_;
    uStack_988 = auStack_4d0._8_8_;
    local_882 = *(ushort *)(in_RCX + (long)(int)uVar21 * 2);
    uStack_8a8 = CONCAT26(local_882,(undefined6)uStack_8a8);
    local_884 = local_882;
    local_886 = local_882;
    local_888 = local_882;
    local_88a = local_882;
    local_88c = local_882;
    local_88e = local_882;
    local_890 = local_882;
    auVar2 = vpinsrw_avx(ZEXT216(local_882),(uint)local_882,1);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_882,2);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_882,3);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_882,4);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_882,5);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_882,6);
    auVar3 = vpinsrw_avx(auVar2,(uint)local_882,7);
    local_8a0 = auVar3;
    local_8a0._0_8_ = auVar3._0_8_;
    local_8a0._8_8_ = auVar3._8_8_;
    local_9d0 = local_8a0._0_8_;
    uStack_9c8 = local_8a0._8_8_;
    local_544 = uVar21;
    auVar2 = vpinsrd_avx(ZEXT416(uVar21),uVar21,1);
    auVar2 = vpinsrd_avx(auVar2,uVar21,2);
    auVar2 = vpinsrd_avx(auVar2,uVar21,3);
    local_50 = auVar2._0_8_;
    uStack_48 = auVar2._8_8_;
    local_9e0 = local_50;
    uStack_9d8 = uStack_48;
    local_a04 = in_R9D;
    for (local_a08 = 0; local_a08 < in_EDI; local_a08 = local_a08 + 1) {
      local_a94 = (int)local_a04 >> ((byte)(6 - in_R8D) & 0x1f);
      if ((int)uVar21 <= (int)local_a94) {
        for (local_a98 = local_a08; local_a98 < in_EDI; local_a98 = local_a98 + 1) {
          local_1120[(long)local_a98 * 2] = local_8a0._0_8_;
          local_1120[(long)local_a98 * 2 + 1] = local_8a0._8_8_;
        }
        break;
      }
      local_7c8 = (undefined1 (*) [16])(in_RCX + (long)(int)local_a94 * 2);
      local_530 = *(undefined8 *)*local_7c8;
      uStack_528 = *(undefined8 *)(*local_7c8 + 8);
      auVar6 = vpmovzxwd_avx2(*local_7c8);
      local_940 = auVar6;
      lVar22 = in_RCX + (long)(int)local_a94 * 2;
      local_7d0 = (undefined1 (*) [16])(lVar22 + 2);
      local_540 = *(undefined8 *)*local_7d0;
      uStack_538 = *(undefined8 *)(lVar22 + 10);
      _local_960 = vpmovzxwd_avx2(*local_7d0);
      if (in_R8D == 0) {
        local_328 = local_a94;
        local_32c = local_a94 + 1;
        local_330 = local_a94 + 2;
        local_334 = local_a94 + 3;
        auVar4 = vpinsrd_avx(ZEXT416(local_a94),local_a94 + 1,1);
        auVar4 = vpinsrd_avx(auVar4,local_a94 + 2,2);
        auVar4 = vpinsrd_avx(auVar4,local_a94 + 3,3);
        local_90 = auVar4._0_8_;
        uStack_88 = auVar4._8_8_;
        local_9f0 = local_90;
        uStack_9e8 = uStack_88;
        local_54c = local_a04;
        local_464 = local_a04;
        local_468 = local_a04;
        local_46c = local_a04;
        local_470 = local_a04;
        local_474 = local_a04;
        local_478 = local_a04;
        local_47c = local_a04;
        local_480 = local_a04;
        auVar4 = vpinsrd_avx(ZEXT416(local_a04),local_a04,1);
        auVar4 = vpinsrd_avx(auVar4,local_a04,2);
        local_4a0 = vpinsrd_avx(auVar4,local_a04,3);
        auVar4 = vpinsrd_avx(ZEXT416(local_a04),local_a04,1);
        auVar4 = vpinsrd_avx(auVar4,local_a04,2);
        auStack_490 = vpinsrd_avx(auVar4,local_a04,3);
        local_550 = 0x3f;
        local_424 = 0x3f;
        local_428 = 0x3f;
        local_42c = 0x3f;
        local_430 = 0x3f;
        local_434 = 0x3f;
        local_438 = 0x3f;
        local_43c = 0x3f;
        local_440 = 0x3f;
        auVar4 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar4 = vpinsrd_avx(auVar4,0x3f,2);
        auVar4 = vpinsrd_avx(auVar4,0x3f,3);
        auVar5 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar5 = vpinsrd_avx(auVar5,0x3f,2);
        auVar5 = vpinsrd_avx(auVar5,0x3f,3);
        local_460._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
        local_460._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
        local_860 = local_4a0._0_8_;
        uStack_858 = local_4a0._8_8_;
        uStack_850 = auStack_490._0_8_;
        uStack_848 = auStack_490._8_8_;
        local_880 = local_460._0_16_;
        auStack_870 = local_460._16_16_;
        auVar13._16_8_ = auStack_490._0_8_;
        auVar13._0_16_ = local_4a0;
        auVar13._24_8_ = auStack_490._8_8_;
        auVar6._16_8_ = local_460._16_8_;
        auVar6._0_16_ = local_460._0_16_;
        auVar6._24_8_ = local_460._24_8_;
        local_2a0 = vpand_avx2(auVar13,auVar6);
        local_2a4 = 1;
        local_a80 = vpsrld_avx2(local_2a0,ZEXT416(1));
      }
      else {
        local_940._0_8_ = auVar6._0_8_;
        local_940._8_8_ = auVar6._8_8_;
        local_940._16_8_ = auVar6._16_8_;
        local_940._24_8_ = auVar6._24_8_;
        local_348 = 7;
        local_34c = 5;
        local_350 = 3;
        local_354 = 1;
        local_358 = 6;
        local_35c = 4;
        local_360 = 2;
        local_364 = 0;
        auVar4 = vpinsrd_avx(ZEXT416(0),2,1);
        auVar4 = vpinsrd_avx(auVar4,4,2);
        local_3a0 = vpinsrd_avx(auVar4,6,3);
        auVar4 = vpinsrd_avx(ZEXT416(1),3,1);
        auVar4 = vpinsrd_avx(auVar4,5,2);
        auStack_390 = vpinsrd_avx(auVar4,7,3);
        local_500 = local_940._0_8_;
        uStack_4f8 = local_940._8_8_;
        uStack_4f0 = local_940._16_8_;
        uStack_4e8 = local_940._24_8_;
        local_520 = local_3a0._0_8_;
        uStack_518 = local_3a0._8_8_;
        uStack_510 = auStack_390._0_8_;
        uStack_508 = auStack_390._8_8_;
        auVar18._16_8_ = auStack_390._0_8_;
        auVar18._0_16_ = local_3a0;
        auVar18._24_8_ = auStack_390._8_8_;
        local_940 = vpermd_avx2(auVar18,auVar6);
        auVar13 = local_940;
        uStack_8b0 = local_940._16_8_;
        uStack_8a8 = local_940._24_8_;
        local_960._8_8_ = uStack_8b8;
        local_960._0_8_ = local_8c0;
        stack0xfffffffffffff6b0 = auVar6._0_16_;
        local_338 = local_a94;
        local_33c = local_a94 + 2;
        local_340 = local_a94 + 4;
        local_344 = local_a94 + 6;
        auVar4 = vpinsrd_avx(ZEXT416(local_a94),local_a94 + 2,1);
        auVar4 = vpinsrd_avx(auVar4,local_a94 + 4,2);
        auVar4 = vpinsrd_avx(auVar4,local_a94 + 6,3);
        local_70 = auVar4._0_8_;
        uStack_68 = auVar4._8_8_;
        local_9f0 = local_70;
        uStack_9e8 = uStack_68;
        local_554 = local_a04;
        local_3e4 = local_a04;
        local_3e8 = local_a04;
        local_3ec = local_a04;
        local_3f0 = local_a04;
        local_3f4 = local_a04;
        local_3f8 = local_a04;
        local_3fc = local_a04;
        local_400 = local_a04;
        auVar4 = vpinsrd_avx(ZEXT416(local_a04),local_a04,1);
        auVar4 = vpinsrd_avx(auVar4,local_a04,2);
        local_420 = vpinsrd_avx(auVar4,local_a04,3);
        auVar4 = vpinsrd_avx(ZEXT416(local_a04),local_a04,1);
        auVar4 = vpinsrd_avx(auVar4,local_a04,2);
        auStack_410 = vpinsrd_avx(auVar4,local_a04,3);
        local_260 = local_420._0_8_;
        uStack_258 = local_420._8_8_;
        uStack_250 = auStack_410._0_8_;
        uStack_248 = auStack_410._8_8_;
        auVar19._16_8_ = auStack_410._0_8_;
        auVar19._0_16_ = local_420;
        auVar19._24_8_ = auStack_410._8_8_;
        local_820 = vpslld_avx2(auVar19,ZEXT416(in_R8D));
        local_558 = 0x3f;
        local_3a4 = 0x3f;
        local_3a8 = 0x3f;
        local_3ac = 0x3f;
        local_3b0 = 0x3f;
        local_3b4 = 0x3f;
        local_3b8 = 0x3f;
        local_3bc = 0x3f;
        local_3c0 = 0x3f;
        auVar4 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar4 = vpinsrd_avx(auVar4,0x3f,2);
        auVar4 = vpinsrd_avx(auVar4,0x3f,3);
        auVar5 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar5 = vpinsrd_avx(auVar5,0x3f,2);
        auVar5 = vpinsrd_avx(auVar5,0x3f,3);
        local_3e0._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
        local_3e0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
        local_840 = local_3e0._0_16_;
        auStack_830 = local_3e0._16_16_;
        auVar14._16_8_ = local_3e0._16_8_;
        auVar14._0_16_ = local_3e0._0_16_;
        auVar14._24_8_ = local_3e0._24_8_;
        local_320 = vpand_avx2(local_820,auVar14);
        local_324 = 1;
        local_a80 = vpsrld_avx2(local_320,ZEXT416(1));
        local_940 = auVar13;
      }
      local_1e0 = local_960._0_8_;
      uStack_1d8 = local_960._8_8_;
      uStack_1d0 = local_960._16_8_;
      uStack_1c8 = uStack_948;
      local_200 = local_940._0_8_;
      uStack_1f8 = local_940._8_8_;
      uStack_1f0 = local_940._16_8_;
      uStack_1e8 = local_940._24_8_;
      local_9c0 = vpsubd_avx2(_local_960,local_940);
      local_220 = local_940._0_8_;
      uStack_218 = local_940._8_8_;
      uStack_210 = local_940._16_8_;
      uStack_208 = local_940._24_8_;
      local_224 = 5;
      auVar6 = vpslld_avx2(local_940,ZEXT416(5));
      local_980._0_8_ = auVar6._0_8_;
      local_980._8_8_ = auVar6._8_8_;
      local_980._16_8_ = auVar6._16_8_;
      local_980._24_8_ = auVar6._24_8_;
      local_160 = local_980._0_8_;
      uStack_158 = local_980._8_8_;
      uStack_150 = local_980._16_8_;
      uStack_148 = local_980._24_8_;
      local_180 = local_4e0._0_8_;
      uStack_178 = local_4e0._8_8_;
      uStack_170 = auStack_4d0._0_8_;
      uStack_168 = auStack_4d0._8_8_;
      auVar20._16_8_ = auStack_4d0._0_8_;
      auVar20._0_16_ = auVar1;
      auVar20._24_8_ = auStack_4d0._8_8_;
      local_980 = vpaddd_avx2(auVar6,auVar20);
      local_120 = local_9c0._0_8_;
      local_140 = local_a80._0_8_;
      uStack_138 = local_a80._8_8_;
      uStack_130 = local_a80._16_8_;
      uStack_128 = local_a80._24_8_;
      local_a40 = vpmulld_avx2(local_9c0,local_a80);
      local_1a0 = local_980._0_8_;
      uStack_198 = local_980._8_8_;
      uStack_190 = local_980._16_8_;
      uStack_188 = local_980._24_8_;
      local_1c0 = local_a40._0_8_;
      uStack_1b8 = local_a40._8_8_;
      uStack_1b0 = local_a40._16_8_;
      uStack_1a8 = local_a40._24_8_;
      auVar6 = vpaddd_avx2(local_980,local_a40);
      local_a60._0_8_ = auVar6._0_8_;
      local_a60._8_8_ = auVar6._8_8_;
      local_a60._16_8_ = auVar6._16_8_;
      local_a60._24_8_ = auVar6._24_8_;
      local_2e0 = local_a60._0_8_;
      uStack_2d8 = local_a60._8_8_;
      uStack_2d0 = local_a60._16_8_;
      uStack_2c8 = local_a60._24_8_;
      local_2e4 = 5;
      local_a60 = vpsrld_avx2(auVar6,ZEXT416(5));
      local_8e0 = local_a60._0_8_;
      uStack_8d8 = local_a60._8_8_;
      uStack_8d0 = local_a60._16_8_;
      uStack_8c8 = local_a60._24_8_;
      local_a90 = vpackusdw_avx(local_a60._0_16_,local_a60._0_16_);
      auVar4._8_8_ = uStack_9e8;
      auVar4._0_8_ = local_9f0;
      auVar4 = vpcmpgtd_avx(auVar2,auVar4);
      local_a00 = vpackssdw_avx(auVar4,auVar4);
      local_5a0 = local_8a0._0_8_;
      uStack_598 = local_8a0._8_8_;
      local_5b0 = local_a90._0_8_;
      uStack_5a8 = local_a90._8_8_;
      local_5c0 = local_a00._0_8_;
      uStack_5b8 = local_a00._8_8_;
      auVar4 = vpblendvb_avx(auVar3,local_a90,local_a00);
      *(undefined1 (*) [16])(local_1120 + (long)local_a08 * 2) = auVar4;
      local_a04 = in_R9D + local_a04;
    }
  }
  for (local_1124 = 0; local_1124 < in_EDI; local_1124 = local_1124 + 1) {
    lVar22 = (long)local_1124;
    local_7d8 = (undefined8 *)(in_RSI + in_RDX * lVar22 * 2);
    local_7f0 = local_1120[lVar22 * 2];
    uStack_7e8 = local_1120[lVar22 * 2 + 1];
    *local_7d8 = local_1120[lVar22 * 2];
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z1_4xN_avx2(int N, uint16_t *dst,
                                             ptrdiff_t stride,
                                             const uint16_t *above,
                                             int upsample_above, int dx,
                                             int bd) {
  __m128i dstvec[16];
  if (bd < 12) {
    highbd_dr_prediction_z1_4xN_internal_avx2(N, dstvec, above, upsample_above,
                                              dx);
  } else {
    highbd_dr_prediction_32bit_z1_4xN_internal_avx2(N, dstvec, above,
                                                    upsample_above, dx);
  }
  for (int i = 0; i < N; i++) {
    _mm_storel_epi64((__m128i *)(dst + stride * i), dstvec[i]);
  }
}